

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<roundTripString>::RegisterTests
          (ParameterizedTestSuiteInfo<roundTripString> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *__s;
  pointer pcVar3;
  element_type *peVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  _Alloc_hider _Var6;
  _Alloc_hider name;
  char cVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  long *plVar12;
  testing *this_00;
  ostream *poVar13;
  size_t sVar14;
  const_iterator cVar15;
  long *plVar16;
  char *pcVar17;
  undefined4 extraout_var_01;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_02;
  pointer pIVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  pointer local_1d0;
  TestParamInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  string param_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t local_120;
  string test_name;
  long *local_f8 [2];
  long local_e8 [2];
  string local_d8;
  ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  generator;
  CodeLocation local_a8;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  ParamNameGeneratorFunc *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  CodeLocation local_58;
  long *plVar11;
  undefined4 extraout_var_00;
  
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  local_1d0 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1d0 != local_80) {
    bVar8 = false;
    do {
      pIVar18 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_78 = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar18 != local_78) {
        do {
          (*pIVar18->generator)(&generator);
          sVar2 = (pIVar18->name)._M_string_length;
          local_68 = pIVar18->name_func;
          __s = pIVar18->file;
          iVar10 = pIVar18->line;
          local_70 = pIVar18;
          if (sVar2 == 0) {
            test_suite_name._M_string_length = 0;
            *test_suite_name._M_dataplus._M_p = '\0';
          }
          else {
            test_param_names._M_t._M_impl._0_8_ =
                 &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar3 = (pIVar18->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&test_param_names,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)&test_param_names);
            std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
            if ((_Base_ptr *)test_param_names._M_t._M_impl._0_8_ !=
                &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)test_param_names._M_t._M_impl._0_8_,
                              (ulong)((long)&(test_param_names._M_t._M_impl.super__Rb_tree_header.
                                              _M_header._M_parent)->_M_color + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&test_suite_name,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          iVar9 = (*(generator.impl_.
                     super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
          plVar11 = (long *)CONCAT44(extraout_var,iVar9);
          iVar9 = (*(generator.impl_.
                     super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
          plVar12 = (long *)CONCAT44(extraout_var_00,iVar9);
          if (plVar11 != plVar12) {
            local_120 = 0;
            while( true ) {
              cVar7 = (**(code **)(*plVar11 + 0x30))(plVar11,plVar12);
              if (cVar7 != '\0') break;
              this_00 = (testing *)(**(code **)(*plVar11 + 0x28))(plVar11);
              test_name._M_string_length = 0;
              *test_name._M_dataplus._M_p = '\0';
              local_1b8.param._M_dataplus._M_p = (pointer)&local_1b8.param.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b8,*(long *)this_00,
                         *(long *)(this_00 + 8) + *(long *)this_00);
              local_1b8.index = local_120;
              (*local_68)(&param_name,&local_1b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8.param._M_dataplus._M_p != &local_1b8.param.field_2) {
                operator_delete(local_1b8.param._M_dataplus._M_p,
                                local_1b8.param.field_2._M_allocated_capacity + 1);
              }
              bVar8 = IsValidParamName(&param_name);
              bVar8 = IsTrue(bVar8);
              if (!bVar8) {
                GTestLog::GTestLog((GTestLog *)&local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,param_name._M_dataplus._M_p,
                                     param_name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
                }
                else {
                  sVar14 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,__s,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," line ",6);
                poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1b8);
              }
              cVar15 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&test_param_names,&param_name);
              bVar8 = IsTrue((_Rb_tree_header *)cVar15._M_node ==
                             &test_param_names._M_t._M_impl.super__Rb_tree_header);
              if (!bVar8) {
                GTestLog::GTestLog((GTestLog *)&local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,param_name._M_dataplus._M_p,
                                     param_name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
                }
                else {
                  sVar14 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,__s,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," line ",6);
                plVar16 = (long *)std::ostream::operator<<((ostream *)poVar13,iVar10);
                std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
                std::ostream::put((char)plVar16);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1b8);
              }
              peVar4 = (local_1d0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar17 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&test_name,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar17);
              }
              std::__cxx11::string::_M_append((char *)&test_name,(ulong)param_name._M_dataplus._M_p)
              ;
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&test_param_names,&param_name);
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,test_suite_name._M_dataplus._M_p,
                         test_suite_name._M_dataplus._M_p + test_suite_name._M_string_length);
              name = test_name._M_dataplus;
              PrintToString<std::__cxx11::string>(&local_1b8.param,this_00,value);
              _Var6._M_p = local_1b8.param._M_dataplus._M_p;
              peVar4 = (local_1d0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_a8.file._M_dataplus._M_p = (pointer)&local_a8.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)_Var6._M_p;
              local_a8.line = (peVar4->code_location).line;
              iVar9 = (*(this->super_ParameterizedTestSuiteInfoBase).
                        _vptr_ParameterizedTestSuiteInfoBase[3])();
              set_up_tc = SuiteApiResolver<roundTripString>::GetSetUpCaseOrSuite(__s,iVar10);
              tear_down_tc = SuiteApiResolver<roundTripString>::GetTearDownCaseOrSuite(__s,iVar10);
              _Var5.
              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
              ._M_head_impl =
                   (((local_1d0->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->test_meta_factory)._M_t.
                   super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
              ;
              local_f8[0] = local_e8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_f8,*(long *)this_00,
                         *(long *)(this_00 + 8) + *(long *)this_00);
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)_Var5.
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                                              ._M_head_impl + 0x10))
                                  (_Var5.
                                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                                   ._M_head_impl,local_f8);
              MakeAndRegisterTestInfo
                        (&local_d8,name._M_p,(char *)0x0,local_60->_M_local_buf,&local_a8,
                         (TypeId)CONCAT44(extraout_var_01,iVar9),set_up_tc,tear_down_tc,factory);
              if (local_f8[0] != local_e8) {
                operator_delete(local_f8[0],local_e8[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8.file._M_dataplus._M_p != &local_a8.file.field_2) {
                operator_delete(local_a8.file._M_dataplus._M_p,
                                local_a8.file.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8.param._M_dataplus._M_p != &local_1b8.param.field_2) {
                operator_delete(local_1b8.param._M_dataplus._M_p,
                                local_1b8.param.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)param_name._M_dataplus._M_p != &param_name.field_2) {
                operator_delete(param_name._M_dataplus._M_p,
                                param_name.field_2._M_allocated_capacity + 1);
              }
              local_120 = local_120 + 1;
              bVar8 = true;
              (**(code **)(*plVar11 + 0x18))(plVar11);
            }
          }
          if (plVar12 != (long *)0x0) {
            (**(code **)(*plVar12 + 8))(plVar12);
          }
          if (plVar11 != (long *)0x0) {
            (**(code **)(*plVar11 + 8))(plVar11);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&test_param_names._M_t);
          if (generator.impl_.
              super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (generator.impl_.
                       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pIVar18 = local_70 + 1;
        } while (pIVar18 != local_78);
      }
      local_1d0 = local_1d0 + 1;
    } while (local_1d0 != local_80);
    if (bVar8) goto LAB_001ae78f;
  }
  iVar10 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                     (this);
  paVar1 = &local_58.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_58.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_02,iVar10),&local_58,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
LAB_001ae78f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_name._M_dataplus._M_p != &test_name.field_2) {
    operator_delete(test_name._M_dataplus._M_p,
                    CONCAT71(test_name.field_2._M_allocated_capacity._1_7_,
                             test_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_suite_name._M_dataplus._M_p != &test_suite_name.field_2) {
    operator_delete(test_suite_name._M_dataplus._M_p,
                    CONCAT71(test_suite_name.field_2._M_allocated_capacity._1_7_,
                             test_suite_name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }